

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O3

bool lua_sj_set_device(char *id,aint ramtop)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = addLuaSourcePositions();
  if (deviceDirectivesCount == 0) {
    if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_start ==
        sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      deviceDirectivesCount = deviceDirectivesCount + 1;
      __assert_fail("!sourcePosStack.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/lua_sjasm.cpp"
                    ,0x147,"bool lua_sj_set_device(const char *, const aint)");
    }
    globalDeviceSourcePos.colEnd =
         sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].colEnd;
    globalDeviceSourcePos.filename =
         sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].filename;
    globalDeviceSourcePos.line =
         sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].line;
    globalDeviceSourcePos.colBegin =
         sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].colBegin;
  }
  deviceDirectivesCount = deviceDirectivesCount + 1;
  bVar1 = SetDevice(id,ramtop);
  if (iVar2 != 0) {
    sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
    super__Vector_impl_data._M_finish =
         sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish + (-1 - (ulong)(iVar2 - 1));
  }
  return bVar1;
}

Assistant:

static bool lua_sj_set_device(const char* id, const aint ramtop = 0) {
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	// refresh source position of first DEVICE directive (to make global-device detection work correctly)
	if (1 == ++deviceDirectivesCount) {
		assert(!sourcePosStack.empty());
		globalDeviceSourcePos = sourcePosStack.back();
	}
	// check for nullptr id??
	bool result = SetDevice(id, ramtop);
	removeLuaSourcePositions(positionsAdded);
	return result;
}